

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rebuildPage(CellArray *pCArray,int iFirst,int nCell,MemPage *pPg)

{
  uint uVar1;
  u8 *puVar2;
  char *pcVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ushort *__dest;
  ushort *puVar13;
  ushort *__src;
  ulong uVar14;
  ushort *puVar15;
  ushort *puVar16;
  int local_6c;
  
  uVar14 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar1 = pPg->pBt->usableSize;
  puVar16 = (ushort *)(puVar2 + (int)uVar1);
  puVar13 = (ushort *)pPg->aCellIdx;
  uVar6 = (uint)(ushort)(*(ushort *)(puVar2 + uVar14 + 5) << 8 |
                        *(ushort *)(puVar2 + uVar14 + 5) >> 8);
  uVar8 = (ulong)uVar6;
  if (uVar1 < uVar6) {
    uVar8 = 0;
  }
  pcVar3 = pPg->pBt->pPager->pTmpSpace;
  memcpy(pcVar3 + uVar8,puVar2 + uVar8,(ulong)(uVar1 - (int)uVar8));
  uVar11 = 0;
  do {
    uVar12 = uVar11;
    if (5 < uVar12) break;
    uVar11 = uVar12 + 1;
  } while (pCArray->ixNx[uVar12] <= iFirst);
  iVar7 = iFirst + nCell;
  local_6c = (int)(uVar12 + 1) + -1;
  puVar15 = (ushort *)pCArray->apEnd[uVar12];
  __dest = puVar16;
  do {
    __src = (ushort *)pCArray->apCell[iFirst];
    uVar11 = (ulong)pCArray->szCell[iFirst];
    if ((__src < puVar2 + uVar8) || (puVar16 <= __src)) {
      if ((puVar15 <= __src) || ((ushort *)((long)__src + uVar11) <= puVar15)) goto LAB_00168d7f;
      uVar9 = 0x12680;
LAB_00168db1:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      iVar5 = 1;
    }
    else {
      if (puVar16 < (ushort *)((long)__src + uVar11)) {
        uVar9 = 0x1267b;
        goto LAB_00168db1;
      }
      __src = (ushort *)((long)__src + ((long)pcVar3 - (long)puVar2));
LAB_00168d7f:
      __dest = (ushort *)((long)__dest - uVar11);
      uVar4 = (short)__dest - (short)puVar2;
      *puVar13 = uVar4 * 0x100 | uVar4 >> 8;
      puVar13 = puVar13 + 1;
      if (__dest < puVar13) {
        uVar9 = 0x12686;
        goto LAB_00168db1;
      }
      memmove(__dest,__src,uVar11);
      iFirst = iFirst + 1;
      iVar5 = 6;
      if (iFirst < iVar7) {
        lVar10 = (long)local_6c;
        iVar5 = 0;
        if (pCArray->ixNx[lVar10] <= iFirst) {
          local_6c = local_6c + 1;
          puVar15 = (ushort *)pCArray->apEnd[lVar10 + 1];
        }
      }
    }
    if (iVar5 != 0) {
      if (iVar5 == 6) {
        pPg->nCell = (u16)nCell;
        iVar7 = 0;
        pPg->nOverflow = '\0';
        (puVar2 + uVar14 + 1)[0] = '\0';
        (puVar2 + uVar14 + 1)[1] = '\0';
        puVar2[uVar14 + 3] = *(u8 *)((long)&pPg->nCell + 1);
        puVar2[uVar14 + 4] = (u8)pPg->nCell;
        puVar2[uVar14 + 5] = (u8)((ulong)((long)__dest - (long)puVar2) >> 8);
        puVar2[uVar14 + 6] = (u8)((long)__dest - (long)puVar2);
        puVar2[uVar14 + 7] = '\0';
      }
      else {
        iVar7 = 0xb;
      }
      return iVar7;
    }
  } while( true );
}

Assistant:

static int rebuildPage(
  CellArray *pCArray,             /* Content to be added to page pPg */
  int iFirst,                     /* First cell in pCArray to use */
  int nCell,                      /* Final number of cells on page */
  MemPage *pPg                    /* The page to be reconstructed */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i = iFirst;                 /* Which cell to copy from pCArray*/
  u32 j;                          /* Start of cell content area */
  int iEnd = i+nCell;             /* Loop terminator */
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pSrcEnd;                    /* Current pCArray->apEnd[k] value */

  assert( i<iEnd );
  j = get2byte(&aData[hdr+5]);
  if( j>(u32)usableSize ){ j = 0; }
  memcpy(&pTmp[j], &aData[j], usableSize - j);

  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pSrcEnd = pCArray->apEnd[k];

  pData = pEnd;
  while( 1/*exit by break*/ ){
    u8 *pCell = pCArray->apCell[i];
    u16 sz = pCArray->szCell[i];
    assert( sz>0 );
    if( SQLITE_WITHIN(pCell,aData+j,pEnd) ){
      if( ((uptr)(pCell+sz))>(uptr)pEnd ) return SQLITE_CORRUPT_BKPT;
      pCell = &pTmp[pCell - aData];
    }else if( (uptr)(pCell+sz)>(uptr)pSrcEnd
           && (uptr)(pCell)<(uptr)pSrcEnd
    ){
      return SQLITE_CORRUPT_BKPT;
    }

    pData -= sz;
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memmove(pData, pCell, sz);
    assert( sz==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pSrcEnd = pCArray->apEnd[k];
    }
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}